

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

void __thiscall
antlr::ASTFactory::registerFactory(ASTFactory *this,int type,char *ast_name,factory_type factory)

{
  undefined8 uVar1;
  ANTLRException *this_00;
  size_type sVar2;
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *this_01;
  reference pppVar3;
  long in_RCX;
  int in_ESI;
  value_type *in_RDI;
  string *in_stack_ffffffffffffff48;
  ANTLRException *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  _func_ASTRefCount<antlr::AST> *local_20;
  char *local_18;
  int local_c;
  
  if (in_ESI < 4) {
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
    ANTLRException::ANTLRException(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    __cxa_throw(uVar1,&ANTLRException::typeinfo,ANTLRException::~ANTLRException);
  }
  if (in_RCX == 0) {
    uVar4 = 1;
    this_00 = (ANTLRException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff87,CONCAT16(uVar4,in_stack_ffffffffffffff80)));
    ANTLRException::ANTLRException(this_00,in_stack_ffffffffffffff48);
    __cxa_throw(this_00,&ANTLRException::typeinfo,ANTLRException::~ANTLRException);
  }
  local_c = in_ESI;
  sVar2 = std::
          vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
          ::size((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                  *)(in_RDI + 3));
  if (sVar2 < local_c + 1) {
    std::
    vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
    ::resize((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
              *)CONCAT17(in_stack_ffffffffffffff87,
                         CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
             (size_type)(in_RDI + 1),in_RDI);
  }
  this_01 = (pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)operator_new(0x10);
  std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>::
  pair<const_char_*&,_antlr::ASTRefCount<antlr::AST>_(*&)(),_true>(this_01,&local_18,&local_20);
  pppVar3 = std::
            vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            ::operator[]((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                          *)(in_RDI + 3),(long)local_c);
  *pppVar3 = this_01;
  return;
}

Assistant:

void ASTFactory::registerFactory( int type, const char* ast_name, factory_type factory )
{
	// check validity of arguments...
	if( type < Token::MIN_USER_TYPE )
		throw ANTLRException("Internal parser error invalid type passed to RegisterFactory");
	if( factory == 0 )
		throw ANTLRException("Internal parser error 0 factory passed to RegisterFactory");

	// resize up to and including 'type' and initalize any gaps to default
	// factory.
	if( nodeFactories.size() < (static_cast<unsigned int>(type)+1) )
		nodeFactories.resize( type+1, &default_factory_descriptor );

	// And add new thing..
	nodeFactories[type] = new ANTLR_USE_NAMESPACE(std)pair<const char*, factory_type>( ast_name, factory );
}